

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  AP_LOG_LEVEL AVar6;
  uint uVar7;
  uint uVar8;
  FILE *pFVar9;
  undefined8 *puVar10;
  char *pcVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  ulong uVar16;
  char **ppcVar17;
  long *plVar18;
  BOOL BVar19;
  AP_CTX ctx;
  uint32_t network;
  uint32_t ip;
  AP_CTX local_4a8;
  uint local_468;
  uint local_464;
  FILE *local_460;
  char *local_458;
  char *local_450;
  ulong local_448;
  char *local_440;
  char *local_438 [129];
  
  if (argv == (char **)0x0) {
    fwrite("Invalid argument: argv\n",0x17,1,_stdout);
    uVar8 = 0;
    uVar7 = 3;
    goto LAB_00102e68;
  }
  local_4a8.client_ip = (char *)0x0;
  local_4a8.client_command = (char *)0x0;
  local_4a8.log_file = (FILE *)0x0;
  local_4a8.simulate = '\0';
  local_4a8._41_7_ = 0;
  local_4a8.config_file = (FILE *)0x0;
  local_4a8.log_path = (char *)0x0;
  local_4a8.default_dir = (char *)0x0;
  local_4a8.config_path = (char *)0x0;
  ap_log_init();
  bVar3 = true;
  if (argc == 1) {
LAB_0010252c:
    uVar7 = 0;
LAB_0010252f:
    bVar4 = false;
  }
  else {
    if (argc == 0) {
      fwrite("argv[0] is missing\n",0x13,1,_stdout);
    }
    else {
      if (argc < 9) {
        pcVar11 = argv[1];
        if (pcVar11 != (char *)0x0) {
          ppcVar17 = argv + 1;
          BVar19 = local_4a8.simulate;
          do {
            pcVar13 = ppcVar17[1];
            iVar5 = strcmp(pcVar11,"-c");
            if (iVar5 == 0) {
              if (pcVar13 == (char *)0x0) {
LAB_00102715:
                local_4a8.simulate = BVar19;
                pcVar14 = "\'%s\' requires an argument\n";
                goto LAB_001027c2;
              }
              local_4a8.config_path = strdup(pcVar13);
              if (local_4a8.config_path == (char *)0x0) {
                pcVar11 = "Cannot allocate memory for \'ctx->config_path\'\n";
                sVar15 = 0x2e;
LAB_00102f4c:
                local_4a8.simulate = BVar19;
                fwrite(pcVar11,sVar15,1,_stdout);
                uVar7 = 4;
                goto LAB_00102424;
              }
LAB_00102517:
              ppcVar17 = ppcVar17 + 2;
            }
            else {
              iVar5 = strcmp(pcVar11,"-l");
              if (iVar5 == 0) {
                if (pcVar13 == (char *)0x0) goto LAB_00102715;
                local_4a8.log_path = strdup(pcVar13);
                if (local_4a8.log_path == (char *)0x0) {
                  pcVar11 = "Cannot allocate memory for \'ctx->log_path\'\n";
                  sVar15 = 0x2b;
                  goto LAB_00102f4c;
                }
                goto LAB_00102517;
              }
              iVar5 = strcmp(pcVar11,"-e");
              if (iVar5 == 0) {
                if (pcVar13 == (char *)0x0) goto LAB_00102715;
                sVar15 = strlen(pcVar13);
                if ((sVar15 == 1) && (0xf9 < (byte)(*pcVar13 - 0x36U))) {
                  ap_log_set_level((uint)(byte)(*pcVar13 - 0x30));
                  goto LAB_00102517;
                }
                local_4a8.simulate = BVar19;
                pcVar14 = "Invalid log level \'%s\'\n";
                pcVar11 = pcVar13;
LAB_001027c2:
                bVar3 = false;
                fprintf(_stdout,pcVar14,pcVar11);
                show_help();
                bVar4 = true;
                uVar7 = 5;
                goto LAB_00102531;
              }
              iVar5 = strcmp(pcVar11,"-s");
              if (iVar5 != 0) {
                local_4a8.simulate = BVar19;
                iVar5 = strcmp(pcVar11,"-v");
                if (iVar5 == 0) {
                  bVar3 = false;
                  fprintf(_stdout,"\nauthprogs %d.%d.%d\n",0,9,0xc9);
                  uVar7 = 1;
                }
                else {
                  iVar5 = strcmp(pcVar11,"-h");
                  if (iVar5 != 0) {
                    pcVar14 = "Invalid argument \'%s\'\n";
                    goto LAB_001027c2;
                  }
                  show_help();
                  uVar7 = 2;
                  bVar3 = false;
                }
                goto LAB_0010252f;
              }
              ppcVar17 = ppcVar17 + 1;
              BVar19 = '\x01';
            }
            pcVar11 = *ppcVar17;
          } while (pcVar11 != (char *)0x0);
          local_4a8.simulate = BVar19;
        }
        goto LAB_0010252c;
      }
      fwrite("Too many arguments\n",0x13,1,_stdout);
      show_help();
    }
    uVar7 = 5;
LAB_00102424:
    bVar4 = true;
    bVar3 = false;
  }
LAB_00102531:
  if (bVar4) {
    uninit(&local_4a8);
  }
  if (bVar3) {
    if (local_4a8.log_path == (char *)0x0) {
      if ((local_4a8.default_dir == (char *)0x0) &&
         ((uVar7 = get_default_directory(&local_4a8), uVar7 != 0 ||
          (uVar7 = create_directory(local_4a8.default_dir), uVar7 != 0)))) {
        bVar3 = false;
      }
      else {
        pcVar11 = local_4a8.default_dir;
        sVar15 = strlen(local_4a8.default_dir);
        sVar15 = sVar15 + 0x11;
        pcVar13 = (char *)calloc(1,sVar15);
        local_4a8.log_path = pcVar13;
        if (pcVar13 == (char *)0x0) {
          ap_log(AP_LOG_LEVEL_ERROR,"Can not allocate memory for \'ctx->log_path\'\n");
          bVar3 = true;
          uVar7 = 4;
        }
        else {
          ap_str_strlcpy(pcVar13,pcVar11,sVar15);
          ap_str_strlcat(pcVar13,"/",sVar15);
          ap_str_strlcat(pcVar13,"authprogs.log",sVar15);
          bVar3 = true;
          uVar7 = 0;
        }
      }
    }
    else {
      bVar3 = false;
      uVar7 = 0;
    }
    if ((bVar3 && uVar7 != 0) && (local_4a8.log_path != (char *)0x0)) {
      free(local_4a8.log_path);
    }
    pcVar11 = local_4a8.log_path;
    if (uVar7 == 0) {
      iVar5 = strcmp(local_4a8.log_path,"stdout");
      if (iVar5 == 0) {
        puVar10 = (undefined8 *)&stdout;
LAB_00102686:
        pFVar9 = (FILE *)*puVar10;
LAB_00102689:
        ap_log_set_output((FILE *)pFVar9);
        uVar7 = 0;
        bVar3 = true;
      }
      else {
        iVar5 = strcmp(pcVar11,"stderr");
        if (iVar5 == 0) {
          puVar10 = (undefined8 *)&stderr;
          goto LAB_00102686;
        }
        pFVar9 = fopen(pcVar11,"at");
        local_4a8.log_file = (FILE *)pFVar9;
        if (pFVar9 != (FILE *)0x0) goto LAB_00102689;
        piVar12 = __errno_location();
        pcVar13 = strerror(*piVar12);
        bVar3 = false;
        ap_log(AP_LOG_LEVEL_ERROR,"Can not open log file \'%s\', error: \'%s\'\n",pcVar11,pcVar13);
        uVar7 = 8;
      }
      if (bVar3) {
        local_438[0] = (char *)0x0;
        pcVar11 = getenv("SSH_CLIENT");
        uVar7 = 6;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "Can not get SSH_CLIENT environment variable\n";
LAB_0010282b:
          bVar3 = false;
          ap_log(AP_LOG_LEVEL_ERROR,pcVar11);
        }
        else {
          if (*pcVar11 == '\0') {
            pcVar11 = "Empty SSH_CLIENT environment variable\n";
            goto LAB_0010282b;
          }
          local_4a8.client_ip = strdup(pcVar11);
          if (local_4a8.client_ip == (char *)0x0) {
            uVar7 = 4;
            pcVar11 = "Can not allocate memory for \'ctx->client_ip\'\n";
            goto LAB_0010282b;
          }
          pcVar11 = strtok_r(local_4a8.client_ip," \t",local_438);
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "Invalid SSH_CLIENT variable\n";
            goto LAB_0010282b;
          }
          uVar7 = 0;
          bVar3 = true;
        }
        if (bVar3) {
          local_438[0] = (char *)0x0;
          pcVar13 = getenv("SSH_ORIGINAL_COMMAND");
          pcVar11 = local_4a8.client_ip;
          if (pcVar13 == (char *)0x0) {
            pcVar11 = "(%s) Can not get SSH_ORIGINAL_COMMAND environment variable\n";
LAB_00102955:
            ap_log(AP_LOG_LEVEL_ERROR,pcVar11,local_4a8.client_ip);
            uVar7 = 6;
          }
          else {
            if (*pcVar13 == '\0') {
              pcVar11 = "(%s) Empty SSH_ORIGINAL_COMMAND environment variable\n";
              goto LAB_00102955;
            }
            ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Client command \'%s\'\n",local_4a8.client_ip,pcVar13);
            AVar6 = ap_log_get_level();
            if (AVar6 == AP_LOG_LEVEL_TRACE) {
              uVar7 = ap_str_to_hex(pcVar13,local_438);
              if (uVar7 == 0) {
                ap_log(AP_LOG_LEVEL_TRACE,"(%s) Client command in hexadecimal \'%s\'\n",pcVar11,
                       local_438[0]);
                free(local_438[0]);
                goto LAB_001028ef;
              }
            }
            else {
LAB_001028ef:
              pcVar13 = strdup(pcVar13);
              local_4a8.client_command = pcVar13;
              if (pcVar13 == (char *)0x0) {
                ap_log(AP_LOG_LEVEL_ERROR,
                       "(%s) Can not allocate memory for \'ctx->client_command\'\n",pcVar11);
                uVar7 = 4;
              }
              else {
                ap_str_trim_head_from_set(pcVar13," \t");
                ap_str_trim_tail_from_set(pcVar13," \t\r\n");
                ap_str_shrink_spaces(pcVar13);
                uVar7 = 0;
              }
            }
          }
          if ((uVar7 == 0) && (uVar7 = init_config_path(&local_4a8), uVar7 == 0)) {
            uVar7 = open_config(&local_4a8);
          }
        }
        else if (local_4a8.client_ip != (char *)0x0) {
          free(local_4a8.client_ip);
        }
      }
    }
  }
  if (uVar7 == 0) {
    AVar6 = ap_log_get_level();
    pcVar11 = local_4a8.client_ip;
    if (AVar6 == AP_LOG_LEVEL_TRACE) {
      if (_environ == (long *)0x0) {
        pcVar13 = "(%s) Can not get environment\n";
      }
      else {
        pcVar13 = "(%s) +------------------------------------+\n";
        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
               local_4a8.client_ip);
        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT START         |\n",pcVar11);
        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",pcVar11);
        lVar2 = *_environ;
        plVar18 = _environ;
        while (lVar2 != 0) {
          plVar18 = plVar18 + 1;
          ap_log(AP_LOG_LEVEL_TRACE,"(%s) | %s\n",pcVar11);
          lVar2 = *plVar18;
        }
        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",pcVar11);
        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT END           |\n",pcVar11);
      }
      ap_log(AP_LOG_LEVEL_TRACE,pcVar13,pcVar11);
    }
    pcVar11 = local_4a8.client_ip;
    bVar3 = false;
    local_440 = local_4a8.client_command;
    local_460 = (FILE *)local_4a8.config_file;
    pFVar9 = (FILE *)local_4a8.config_file;
LAB_00102a9d:
    pcVar13 = fgets((char *)local_438,0x400,pFVar9);
    if (pcVar13 != (char *)0x0) {
      do {
        pcVar14 = ap_str_trim_head_from_set((char *)local_438," \t");
        ap_str_trim_tail_from_set(pcVar14," \t\r\n");
        ap_str_shrink_spaces(pcVar14);
        ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing line \'%s\'\n",pcVar11,pcVar14);
        sVar15 = strlen(pcVar14);
        pcVar13 = local_440;
        cVar1 = *pcVar14;
        if ((cVar1 != '#') && (sVar15 != 0 && cVar1 != ';')) {
          if (cVar1 == '[') {
            if (pcVar14[sVar15 - 1] == ']') {
LAB_00102b42:
              if (pcVar14[sVar15 - 1] == ']') goto LAB_00102be5;
LAB_00102b4d:
              if (bVar3) {
                iVar5 = ap_str_match(local_440,pcVar14,";{}|`()&");
                if (iVar5 == 0x10) {
                  ap_log(AP_LOG_LEVEL_DEBUG,
                         "(%s) Invalid characters \'%s\' in command \'%s\', not allowed in the substring matched by \'*\'\n"
                         ,pcVar11,";{}|`()&",pcVar13);
                  pFVar9 = local_460;
                }
                else {
                  if (iVar5 == 0) {
                    uVar7 = 0;
                    ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command matched by config line \'%s\'\n",pcVar11
                           ,pcVar14);
                    bVar3 = true;
                    goto LAB_00102e2f;
                  }
                  ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command doesn\'t match\n",pcVar11);
                  pFVar9 = local_460;
                }
              }
            }
          }
          else if (pcVar14[sVar15 - 1] != ']') {
            if (cVar1 == '[') goto LAB_00102b42;
            goto LAB_00102b4d;
          }
        }
        pcVar13 = fgets((char *)local_438,0x400,pFVar9);
        if (pcVar13 == (char *)0x0) break;
      } while( true );
    }
    bVar3 = false;
    uVar7 = 0;
    goto LAB_00102e2f;
  }
  goto LAB_00102e66;
LAB_00102be5:
  local_458 = (char *)0x0;
  sVar15 = strlen(pcVar14);
  pcVar14[sVar15 - 1] = '\0';
  pcVar13 = ap_str_trim_from_set(pcVar14 + 1," \t");
  ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing ip list \'%s\'\n",pcVar11,pcVar13);
  pcVar13 = strtok_r(pcVar13," \t",&local_458);
  if (pcVar13 == (char *)0x0) {
    uVar7 = 0;
    bVar3 = false;
  }
  else {
    do {
      ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Token \'%s\'\n",pcVar11,pcVar13);
      ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP \'%s\'\n",pcVar11,pcVar13);
      iVar5 = strncmp(pcVar13,"ALL",3);
      if (iVar5 == 0) {
        bVar3 = true;
        pcVar13 = "(%s) IP match\n";
LAB_00102dcc:
        uVar7 = 0;
        ap_log(AP_LOG_LEVEL_DEBUG,pcVar13,pcVar11);
      }
      else {
        local_450 = (char *)0x0;
        pcVar14 = strtok_r(pcVar13,"/",&local_450);
        if (pcVar14 == (char *)0x0) {
          bVar3 = false;
          ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid network address \'%s\'\n",pcVar11,pcVar13);
          uVar7 = 0xd;
        }
        else {
          pcVar13 = strtok_r((char *)0x0,"/",&local_450);
          if (pcVar13 == (char *)0x0) {
            pcVar13 = "32";
          }
          uVar16 = strtoul(pcVar13,(char **)0x0,10);
          if (uVar16 < 0x21) {
            local_448 = uVar16;
            uVar7 = ip_str_to_ip(&local_4a8,pcVar11,&local_464);
            if (uVar7 == 0) {
              uVar8 = ip_str_to_ip(&local_4a8,pcVar14,&local_468);
              uVar7 = 0;
              if (uVar8 == 0) {
                uVar8 = -1 << (-(char)local_448 & 0x1fU);
                if (local_448 == 0) {
                  uVar8 = 0;
                }
                if (local_464 < (local_468 & uVar8)) goto LAB_00102d63;
                bVar3 = local_464 <= (local_468 | ~uVar8);
              }
              else {
                bVar3 = false;
                uVar7 = uVar8;
              }
            }
            else {
LAB_00102d63:
              bVar3 = false;
            }
          }
          else {
            bVar3 = false;
            ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid prefix \'%s\'\n",pcVar11,pcVar13);
            uVar7 = 0xe;
          }
        }
        if (uVar7 == 0) {
          pcVar13 = "(%s) IP match\n";
          if (!bVar3) {
            pcVar13 = "(%s) IP doesn\'t match\n";
          }
          goto LAB_00102dcc;
        }
      }
      if (uVar7 != 0) break;
      if (bVar3) {
        uVar7 = 0;
        break;
      }
      uVar7 = 0;
      pcVar13 = strtok_r((char *)0x0," \t",&local_458);
    } while (pcVar13 != (char *)0x0);
  }
  if (uVar7 != 0) goto code_r0x00102e23;
  goto LAB_00102a9d;
code_r0x00102e23:
  bVar3 = false;
LAB_00102e2f:
  pcVar11 = local_4a8.client_command;
  if (uVar7 == 0) {
    if (bVar3) {
      if (local_4a8.simulate == '\0') {
        uVar8 = system(local_4a8.client_command);
        if (uVar8 == 0xffffffff) {
          pcVar13 = "(%s) Can not execute the shell for command \'%s\'\n";
        }
        else {
          uVar8 = uVar8 >> 8 & 0xff;
          if (uVar8 != 0x7f) {
            uVar7 = 0;
            ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
                   "(%s) Successfully executed command \'%s\', exit code \'%d\'\n",
                   local_4a8.client_ip,pcVar11,(ulong)uVar8);
            goto LAB_00102e68;
          }
          pcVar13 = 
          "(%s) Can not execute command, shell was executed, but the command inside the shell wasn\'t \'%s\'\n"
          ;
        }
        uVar8 = 0;
        ap_log(AP_LOG_LEVEL_ERROR,pcVar13,local_4a8.client_ip,pcVar11);
        uVar7 = 10;
        goto LAB_00102e68;
      }
      uVar7 = 0;
      ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
             "(%s) Successfully executed command \'%s\', exit code \'%d\'\n",local_4a8.client_ip,
             local_4a8.client_command,0);
    }
    else {
      main_cold_1();
      uVar7 = 0;
    }
  }
LAB_00102e66:
  uVar8 = 0;
LAB_00102e68:
  if ((uVar7 != 0) && (uVar8 = 0, 2 < uVar7)) {
    main_cold_2();
    uVar8 = uVar7;
  }
  uninit(&local_4a8);
  return uVar8;
}

Assistant:

int main (int argc, char *argv[])
{
	int				rc							= AP_NO_ERROR;
	AP_CTX			ctx;
	BOOL			ip_command_match			= FALSE;
	int				exit_code;
	BOOL			exit_code_set				= FALSE;
	
	if (argv == NULL)
	{
		fprintf (stdout, "Invalid argument: argv\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

	memset (&ctx, 0, sizeof (AP_CTX));

	rc = init (&ctx, argc, argv);
	if (rc != AP_NO_ERROR)
	{	
		goto finish;
	}

	if (ap_log_get_level () == AP_LOG_LEVEL_TRACE)
	{
		print_environment (&ctx);
	}
	
	rc = parse_config (&ctx, &ip_command_match);
	if (rc != AP_NO_ERROR)
	{
		goto finish;
	}
	
	if (ip_command_match == TRUE)
	{
		rc = run_command (&ctx, &exit_code);
		if (rc != AP_NO_ERROR)
		{
			goto finish;
		}

		exit_code_set = TRUE;
	}
	else
	{
		ap_denied ("(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
		fprintf (stderr, "(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
	}
	
finish:
	if (rc == AP_NO_ERROR)
	{
		if (exit_code_set == TRUE)
		{
			rc = exit_code;
		}
	}
	else
	{
		if (rc == AP_ERROR_VERSION || rc == AP_ERROR_HELP)
		{
			rc = AP_NO_ERROR;
		}
		else
		{
			fprintf (stderr, "authprogs denied your access, please check the log on server (default: '~/.ssh/authprogs.log')\n");
		}
	}

	uninit (&ctx);

	return rc;
}